

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::OperatorAddFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunctionSet *in_RDI;
  element_type *type;
  LogicalType local_1550;
  LogicalType local_1538;
  string local_1520;
  ScalarFunction local_1500;
  ScalarFunction local_13d8;
  ScalarFunction local_12b0;
  ScalarFunction local_1188;
  ScalarFunction local_1060;
  ScalarFunction local_f38;
  ScalarFunction local_e10;
  ScalarFunction local_ce8;
  ScalarFunction local_bc0;
  ScalarFunction local_a98;
  ScalarFunction local_970;
  ScalarFunction local_848;
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ::std::__cxx11::string::string((string *)&local_1520,"+",(allocator *)&local_1550);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_1520);
  ::std::__cxx11::string::~string((string *)&local_1520);
  LogicalType::Numeric();
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  for (type = (element_type *)local_1550._0_8_;
      type != local_1550.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      type = (element_type *)&(type->alias)._M_string_length) {
    AddFunction::GetFunction(&local_158,(LogicalType *)type);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_158);
    ScalarFunction::~ScalarFunction(&local_158);
    AddFunction::GetFunction(&local_280,(LogicalType *)type,(LogicalType *)type);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_280);
    ScalarFunction::~ScalarFunction(&local_280);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1550);
  LogicalType::LogicalType(&local_1550,DATE);
  LogicalType::LogicalType(&local_1538,INTEGER);
  AddFunction::GetFunction(&local_3a8,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,INTEGER);
  LogicalType::LogicalType(&local_1538,DATE);
  AddFunction::GetFunction(&local_4d0,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,INTERVAL);
  LogicalType::LogicalType(&local_1538,INTERVAL);
  AddFunction::GetFunction(&local_5f8,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,DATE);
  LogicalType::LogicalType(&local_1538,INTERVAL);
  AddFunction::GetFunction(&local_720,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_720);
  ScalarFunction::~ScalarFunction(&local_720);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,INTERVAL);
  LogicalType::LogicalType(&local_1538,DATE);
  AddFunction::GetFunction(&local_848,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_848);
  ScalarFunction::~ScalarFunction(&local_848);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,TIME);
  LogicalType::LogicalType(&local_1538,INTERVAL);
  AddFunction::GetFunction(&local_970,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_970);
  ScalarFunction::~ScalarFunction(&local_970);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,INTERVAL);
  LogicalType::LogicalType(&local_1538,TIME);
  AddFunction::GetFunction(&local_a98,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_a98);
  ScalarFunction::~ScalarFunction(&local_a98);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,TIMESTAMP);
  LogicalType::LogicalType(&local_1538,INTERVAL);
  AddFunction::GetFunction(&local_bc0,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_bc0);
  ScalarFunction::~ScalarFunction(&local_bc0);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,INTERVAL);
  LogicalType::LogicalType(&local_1538,TIMESTAMP);
  AddFunction::GetFunction(&local_ce8,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_ce8);
  ScalarFunction::~ScalarFunction(&local_ce8);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,TIME_TZ);
  LogicalType::LogicalType(&local_1538,INTERVAL);
  AddFunction::GetFunction(&local_e10,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_e10);
  ScalarFunction::~ScalarFunction(&local_e10);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,INTERVAL);
  LogicalType::LogicalType(&local_1538,TIME_TZ);
  AddFunction::GetFunction(&local_f38,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_f38);
  ScalarFunction::~ScalarFunction(&local_f38);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,TIME);
  LogicalType::LogicalType(&local_1538,DATE);
  AddFunction::GetFunction(&local_1060,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1060);
  ScalarFunction::~ScalarFunction(&local_1060);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,DATE);
  LogicalType::LogicalType(&local_1538,TIME);
  AddFunction::GetFunction(&local_1188,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1188);
  ScalarFunction::~ScalarFunction(&local_1188);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,TIME_TZ);
  LogicalType::LogicalType(&local_1538,DATE);
  AddFunction::GetFunction(&local_12b0,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_12b0);
  ScalarFunction::~ScalarFunction(&local_12b0);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  LogicalType::LogicalType(&local_1550,DATE);
  LogicalType::LogicalType(&local_1538,TIME_TZ);
  AddFunction::GetFunction(&local_13d8,&local_1550,&local_1538);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_13d8);
  ScalarFunction::~ScalarFunction(&local_13d8);
  LogicalType::~LogicalType(&local_1538);
  LogicalType::~LogicalType(&local_1550);
  ListConcatFun::GetFunction();
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1500);
  ScalarFunction::~ScalarFunction(&local_1500);
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorAddFun::GetFunctions() {
	ScalarFunctionSet add("+");
	for (auto &type : LogicalType::Numeric()) {
		// unary add function is a nop, but only exists for numeric types
		add.AddFunction(AddFunction::GetFunction(type));
		// binary add function adds two numbers together
		add.AddFunction(AddFunction::GetFunction(type, type));
	}
	// we can add integers to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::INTEGER));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTEGER, LogicalType::DATE));
	// we can add intervals together
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::INTERVAL));
	// we can add intervals to dates/times/timestamps
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::DATE));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIME));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIMESTAMP));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIME_TZ));

	// we can add times to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME, LogicalType::DATE));
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::TIME));

	// we can add times with time zones (offsets) to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::DATE));
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::TIME_TZ));

	// we can add lists together
	add.AddFunction(ListConcatFun::GetFunction());

	return add;
}